

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O1

void __thiscall comparer_context::cmp<unsigned_char>(comparer_context *this,size_t num,string *name)

{
  ostream *poVar1;
  size_t sVar2;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if (num != 0) {
    sVar2 = 0;
    do {
      std::__cxx11::stringstream::stringstream(local_1b8);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"[",1);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
      std::__cxx11::stringbuf::str();
      cmp<unsigned_char>(this,&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      sVar2 = sVar2 + 1;
    } while (num != sVar2);
  }
  return;
}

Assistant:

void cmp(size_t num,const std::string& name) {
        for(size_t n = 0; n < num; ++n) {
            std::stringstream ss;
            cmp<T>((ss<<name<<"["<<n<<"]",ss.str()));
    //      std::cout << name << " " << std::hex << a << std::endl;
        }
    }